

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O1

QPlatformNativeInterface * __thiscall
QOffscreenIntegration::nativeInterface(QOffscreenIntegration *this)

{
  QOffscreenPlatformNativeInterface *pQVar1;
  QOffscreenPlatformNativeInterface *this_00;
  
  if ((this->m_nativeInterface).d == (QPlatformNativeInterface *)0x0) {
    this_00 = (QOffscreenPlatformNativeInterface *)operator_new(0x18);
    QOffscreenPlatformNativeInterface::QOffscreenPlatformNativeInterface(this_00,this);
    pQVar1 = (QOffscreenPlatformNativeInterface *)(this->m_nativeInterface).d;
    if ((pQVar1 != this_00) &&
       ((this->m_nativeInterface).d = (QPlatformNativeInterface *)this_00,
       pQVar1 != (QOffscreenPlatformNativeInterface *)0x0)) {
      (**(code **)(*(long *)pQVar1 + 0x20))();
    }
  }
  return (this->m_nativeInterface).d;
}

Assistant:

QPlatformNativeInterface *QOffscreenIntegration::nativeInterface() const
{
    if (!m_nativeInterface)
        m_nativeInterface.reset(new QOffscreenPlatformNativeInterface(const_cast<QOffscreenIntegration*>(this)));
    return m_nativeInterface.get();
}